

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void ScaDblWrd(GmfMshSct *msh,void *ptr)

{
  size_t sVar1;
  char *in_RSI;
  long in_RDI;
  
  sVar1 = fread(in_RSI,4,2,*(FILE **)(in_RDI + 0x300410));
  if (sVar1 != 2) {
    longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x1b);
  }
  if (*(int *)(in_RDI + 0x10) != 1) {
    SwpWrd(in_RSI,8);
  }
  return;
}

Assistant:

static void ScaDblWrd(GmfMshSct *msh, void *ptr)
{
#ifdef WITH_GMF_AIO
   if(read(msh->FilDes, ptr, WrdSiz * 2) != WrdSiz * 2)
#else
   if( fread(ptr, WrdSiz, 2, msh->hdl) != 2 )
#endif
      longjmp(msh->err, -27);

   if(msh->cod != 1)
      SwpWrd((char *)ptr, 2 * WrdSiz);
}